

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionCacheThreads_Test::TestBody
          (SSLVersionTest_SessionCacheThreads_Test *this)

{
  undefined8 __p;
  pointer ptVar1;
  char cVar2;
  UniquePtr<SSL_SESSION> UVar3;
  bool bVar4;
  size_type sVar5;
  pointer ptVar6;
  thread *ptVar7;
  allocator_type *paVar8;
  size_t sVar9;
  pointer ptVar10;
  allocator_type *paVar11;
  anon_class_8_1_e77a0050_for__M_head_impl *__args;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_00;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_01;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_02;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_03;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_04;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_05;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_04;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_06;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_05;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_07;
  anon_class_16_2_e5bd8863_for__M_head_impl *extraout_RDX_06;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_08;
  anon_class_16_2_e5bd8863_for__M_head_impl *__args_09;
  anon_class_24_3_50f8e216_for__M_head_impl *extraout_RDX_07;
  anon_class_24_3_50f8e216_for__M_head_impl *__args_10;
  anon_class_24_3_50f8e216_for__M_head_impl *extraout_RDX_08;
  anon_class_24_3_50f8e216_for__M_head_impl *__args_11;
  anon_class_24_3_50f8e216_for__M_head_impl *extraout_RDX_09;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_12;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_13;
  anon_class_16_2_0509053c_for__M_head_impl *extraout_RDX_10;
  anon_class_8_1_e77a0050_for__M_head_impl *__args_14;
  anon_class_16_2_0509053c_for__M_head_impl *extraout_RDX_11;
  anon_class_16_2_0509053c_for__M_head_impl *__args_15;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_12;
  anon_class_16_2_0509053c_for__M_head_impl *__args_16;
  anon_class_16_2_e5bd8862_for__M_head_impl *extraout_RDX_13;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_17;
  anon_class_16_2_e5bd8862_for__M_head_impl *__args_18;
  thread *thread_1;
  pointer ptVar12;
  SSL_CTX *ctx;
  char *message;
  char *in_R9;
  int iVar13;
  thread *thread;
  AssertionResult gtest_ar_;
  anon_class_8_1_8991fb9c connect_with_session;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  size_type sStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  UniquePtr<SSL_SESSION> session2;
  UniquePtr<SSL_SESSION> session1;
  AssertHelper local_70;
  UniquePtr<SSL_SESSION> expired_session2;
  UniquePtr<SSL_SESSION> expired_session1;
  AssertHelper local_48;
  size_t limit;
  size_type local_38;
  
  SSL_CTX_set_options((this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x4000);
  SSL_CTX_set_session_cache_mode
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  ctx = (this->super_SSLVersionTest).server_ctx_._M_t.
        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  SSL_CTX_set_session_cache_mode(ctx,3);
  bVar4 = SSLVersionTest::is_tls13((SSLVersionTest *)ctx);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_b8;
  if (bVar4) {
    local_a8._M_p = (pointer)&local_98;
    local_b8._8_8_ = 0;
    sStack_a0 = 0;
    local_98._8_8_ = 0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8._M_allocated_capacity = 0;
    local_98._M_allocated_capacity = 0;
    local_88._0_4_ = 0;
    local_88._4_1_ = false;
    local_88._5_3_ = 0;
    CreateClientSession((anon_unknown_0 *)&session1,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)&threads);
    UVar3 = session1;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
         session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session1);
    ClientConfig::~ClientConfig((ClientConfig *)&threads);
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        UVar3._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&session1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&threads,(internal *)&gtest_ar_,
                 (AssertionResult *)"CreateClientSession(client_ctx_.get(), server_ctx_.get())",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&session2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x199b,(char *)threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      testing::internal::AssertHelper::operator=((AssertHelper *)&session2,(Message *)&session1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&session2);
      std::__cxx11::string::~string((string *)&threads);
      if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
          session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)session1._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    return;
  }
  local_b8._8_8_ = 0;
  sStack_a0 = 0;
  local_98._8_8_ = 0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_allocated_capacity = 0;
  local_98._M_allocated_capacity = 0;
  local_88._0_4_ = 0;
  local_88._4_1_ = false;
  local_88._5_3_ = 0;
  local_a8._M_p = (pointer)&local_98;
  CreateClientSession((anon_unknown_0 *)&session1,
                      (this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (ClientConfig *)&threads);
  ClientConfig::~ClientConfig((ClientConfig *)&threads);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
       session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
      session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&session2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&threads,(internal *)&gtest_ar_,(AssertionResult *)0x2fd561,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&connect_with_session,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x19a2,(char *)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&connect_with_session,(Message *)&session2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&connect_with_session);
    std::__cxx11::string::~string((string *)&threads);
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)session2._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_0019a674;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_b8._8_8_ = 0;
  sStack_a0 = 0;
  local_98._8_8_ = 0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_allocated_capacity = 0;
  local_98._M_allocated_capacity = 0;
  local_88._0_4_ = 0;
  local_88._4_1_ = false;
  local_88._5_3_ = 0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_b8;
  local_a8._M_p = (pointer)&local_98;
  CreateClientSession((anon_unknown_0 *)&session2,
                      (this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (ClientConfig *)&threads);
  ClientConfig::~ClientConfig((ClientConfig *)&threads);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
       session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
      session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&connect_with_session);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&threads,(internal *)&gtest_ar_,(AssertionResult *)0x2fd572,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&limit,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x19a5,(char *)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&limit,(Message *)&connect_with_session);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&limit);
    std::__cxx11::string::~string((string *)&threads);
    if (connect_with_session.this != (SSLVersionTest_SessionCacheThreads_Test *)0x0) {
      (*((connect_with_session.this)->super_SSLVersionTest).
        super_TestWithParam<bssl::(anonymous_namespace)::VersionParam>.super_Test._vptr_Test[1])();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_._0_8_ = &connect_with_session;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    connect_with_session.this = this;
    sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&threads,1,"vector::_M_realloc_insert");
    ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                       (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,sVar5
                       );
    std::allocator_traits<std::allocator<std::thread>>::
    construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__0>
              ((allocator_type *)((long)ptVar6 - (long)ptVar1),(thread *)&gtest_ar_,__args);
    ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                       (ptVar1,(thread *)0x0,ptVar6,(allocator<std::thread> *)&threads);
    paVar8 = (allocator_type *)
             std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                       ((thread *)0x0,ptVar12,ptVar7 + 1,(allocator<std::thread> *)&threads);
    std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
              ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar1,
               (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage - (long)ptVar1 >> 3);
    paVar11 = (allocator_type *)(ptVar6 + sVar5);
    gtest_ar_._0_8_ = &connect_with_session;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = ptVar6;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar8;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)paVar11;
    if (paVar8 == paVar11) {
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                         (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                          sVar5);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__1>
                ((allocator_type *)(((long)paVar11 - (long)ptVar1) + (long)ptVar6),
                 (thread *)&gtest_ar_,__args_01);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar1,(thread *)paVar8,ptVar6,(allocator<std::thread> *)&threads);
      paVar11 = (allocator_type *)
                std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                          ((thread *)paVar8,ptVar12,ptVar7 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar1,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar1 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar6 + sVar5;
      __args_02 = extraout_RDX_00;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar6;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__1>
                (paVar8,(thread *)&gtest_ar_,__args_00);
      paVar11 = (allocator_type *)
                (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1);
      __args_02 = extraout_RDX;
    }
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    gtest_ar_._0_8_ = &connect_with_session;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&session1;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar11;
    if (paVar11 ==
        (allocator_type *)
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                          (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                           sVar5);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__2>
                ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                 (thread *)&gtest_ar_,__args_03);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar12,(thread *)paVar11,ptVar10,(allocator<std::thread> *)&threads);
      paVar11 = (allocator_type *)
                std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                          ((thread *)paVar11,ptVar6,ptVar7 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar10 + sVar5;
      __args_04 = extraout_RDX_02;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar10;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__2>
                (paVar11,(thread *)&gtest_ar_,__args_02);
      paVar11 = (allocator_type *)
                (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1);
      __args_04 = extraout_RDX_01;
    }
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    gtest_ar_._0_8_ = &connect_with_session;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&session1;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar11;
    if (paVar11 ==
        (allocator_type *)
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                          (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                           sVar5);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__3>
                ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                 (thread *)&gtest_ar_,__args_05);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar12,(thread *)paVar11,ptVar10,(allocator<std::thread> *)&threads);
      paVar11 = (allocator_type *)
                std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                          ((thread *)paVar11,ptVar6,ptVar7 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar10 + sVar5;
      __args_06 = extraout_RDX_04;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar10;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__3>
                (paVar11,(thread *)&gtest_ar_,__args_04);
      paVar11 = (allocator_type *)
                (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1);
      __args_06 = extraout_RDX_03;
    }
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    gtest_ar_._0_8_ = &connect_with_session;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&session2;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar11;
    if (paVar11 ==
        (allocator_type *)
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                          (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                           sVar5);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__4>
                ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                 (thread *)&gtest_ar_,__args_07);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar12,(thread *)paVar11,ptVar10,(allocator<std::thread> *)&threads);
      paVar11 = (allocator_type *)
                std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                          ((thread *)paVar11,ptVar6,ptVar7 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar10 + sVar5;
      __args_08 = extraout_RDX_06;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar10;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__4>
                (paVar11,(thread *)&gtest_ar_,__args_06);
      paVar11 = (allocator_type *)
                (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1);
      __args_08 = extraout_RDX_05;
    }
    ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    gtest_ar_._0_8_ = &connect_with_session;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&session2;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)paVar11;
    if (paVar11 ==
        (allocator_type *)
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&threads,1,"vector::_M_realloc_insert");
      ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                          (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                           sVar5);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__5>
                ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                 (thread *)&gtest_ar_,__args_09);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar12,(thread *)paVar11,ptVar10,(allocator<std::thread> *)&threads);
      ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         ((thread *)paVar11,ptVar6,ptVar7 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ptVar10 + sVar5;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar10;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar7;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__5>
                (paVar11,(thread *)&gtest_ar_,__args_08);
      ptVar7 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
      ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar7;
    }
    for (; ptVar10 != ptVar7; ptVar10 = ptVar10 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    sVar9 = SSL_CTX_sess_number((this->super_SSLVersionTest).server_ctx_._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    limit = sVar9 + 2;
    SSL_CTX_sess_set_cache_size
              ((this->super_SSLVersionTest).server_ctx_._M_t.
               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,limit);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar13 = 4;
    __args_10 = extraout_RDX_07;
    while (ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish, bVar4 = iVar13 != 0, iVar13 = iVar13 + -1,
          ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start, bVar4) {
      gtest_ar_._0_8_ = &connect_with_session;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )this;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          (&threads,1,"vector::_M_realloc_insert");
        ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                            ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,
                             sVar5);
        local_38 = sVar5;
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__6>
                  ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                   (thread *)&gtest_ar_,__args_11);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar12,ptVar1,ptVar10,(allocator<std::thread> *)&threads);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar1,ptVar6,ptVar7 + 1,(allocator<std::thread> *)&threads);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12,
                   (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >> 3);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ptVar10 + local_38;
        __args_10 = extraout_RDX_09;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = ptVar10;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar7;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__6>
                  ((allocator_type *)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)&gtest_ar_,__args_10);
        __args_10 = extraout_RDX_08;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    for (; ptVar12 != ptVar1; ptVar12 = ptVar12 + 1) {
      std::thread::join();
    }
    expired_session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         SSL_CTX_sess_number((this->super_SSLVersionTest).server_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_,"SSL_CTX_sess_number(server_ctx_.get())","limit",
               (unsigned_long *)&expired_session1,&limit);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&expired_session1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&expired_session2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x19cc,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&expired_session2,(Message *)&expired_session1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expired_session2);
      if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
          expired_session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)expired_session1._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)&threads);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
      }
      cVar2 = (char)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)&threads);
      if (cVar2 == '\0') {
        SSL_CTX_set_options((this->super_SSLVersionTest).server_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x4000);
        SSL_CTX_set_session_cache_mode
                  ((this->super_SSLVersionTest).client_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
        SSL_CTX_set_session_cache_mode
                  ((this->super_SSLVersionTest).server_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
        SSL_CTX_set_current_time_cb
                  ((this->super_SSLVersionTest).server_ctx_._M_t.
                   super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,CurrentTimeCallback);
        (anonymous_namespace)::g_current_time = 1000;
        local_b8._8_8_ = 0;
        sStack_a0 = 0;
        local_98._8_8_ = 0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_b8;
        local_b8._M_allocated_capacity = 0;
        local_a8._M_p = (pointer)&local_98;
        local_98._M_allocated_capacity = 0;
        local_88._0_4_ = 0;
        local_88._4_1_ = false;
        local_88._5_3_ = 0;
        CreateClientSession((anon_unknown_0 *)&expired_session1,
                            (this->super_SSLVersionTest).client_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (this->super_SSLVersionTest).server_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (ClientConfig *)&threads);
        ClientConfig::~ClientConfig((ClientConfig *)&threads);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
             expired_session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
            expired_session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&expired_session2);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&threads,(internal *)&gtest_ar_,(AssertionResult *)"expired_session1"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x19da,(char *)threads.
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&expired_session2);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          std::__cxx11::string::~string((string *)&threads);
          if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
              expired_session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)expired_session2._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))
                      ();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          local_b8._8_8_ = 0;
          sStack_a0 = 0;
          local_98._8_8_ = 0;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)&local_b8;
          local_b8._M_allocated_capacity = 0;
          local_a8._M_p = (pointer)&local_98;
          local_98._M_allocated_capacity = 0;
          local_88._0_4_ = 0;
          local_88._4_1_ = false;
          local_88._5_3_ = 0;
          CreateClientSession((anon_unknown_0 *)&expired_session2,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (this->super_SSLVersionTest).server_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (ClientConfig *)&threads);
          ClientConfig::~ClientConfig((ClientConfig *)&threads);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
               expired_session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
              expired_session2._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&threads,(internal *)&gtest_ar_,
                       (AssertionResult *)"expired_session2","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_48,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x19dd,(char *)threads.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
LAB_0019a398:
            testing::internal::AssertHelper::~AssertHelper(&local_48);
            std::__cxx11::string::~string((string *)&threads);
            if (local_70.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            (anonymous_namespace)::g_current_time = (anonymous_namespace)::g_current_time + 720000;
            local_b8._8_8_ = 0;
            sStack_a0 = 0;
            local_98._8_8_ = 0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)&local_b8;
            local_b8._M_allocated_capacity = 0;
            local_a8._M_p = (pointer)&local_98;
            local_98._M_allocated_capacity = 0;
            local_88._0_4_ = 0;
            local_88._4_1_ = false;
            local_88._5_3_ = 0;
            CreateClientSession((anon_unknown_0 *)&gtest_ar_,
                                (this->super_SSLVersionTest).client_ctx_._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                (this->super_SSLVersionTest).server_ctx_._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                (ClientConfig *)&threads);
            __p = gtest_ar_._0_8_;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&session1,
                       (pointer)__p);
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar_);
            ClientConfig::~ClientConfig((ClientConfig *)&threads);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
                 session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
                session1._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&local_70);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&threads,(internal *)&gtest_ar_,(AssertionResult *)0x2fd561,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_48,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x19e1,(char *)threads.
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_70);
              goto LAB_0019a398;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            gtest_ar_._0_8_ = &connect_with_session;
            sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                              (&threads,1,"vector::_M_realloc_insert");
            ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start;
            ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                               (&threads.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>,sVar5
                               );
            std::allocator_traits<std::allocator<std::thread>>::
            construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__7>
                      ((allocator_type *)((long)ptVar6 - (long)ptVar1),(thread *)&gtest_ar_,
                       __args_12);
            ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                               (ptVar1,(thread *)0x0,ptVar6,(allocator<std::thread> *)&threads);
            paVar8 = (allocator_type *)
                     std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                               ((thread *)0x0,ptVar12,ptVar7 + 1,(allocator<std::thread> *)&threads)
            ;
            std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                      ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar1,
                       (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar1 >> 3);
            paVar11 = (allocator_type *)(ptVar6 + sVar5);
            gtest_ar_._0_8_ = &connect_with_session;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_start = ptVar6;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)paVar8;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)paVar11;
            if (paVar8 == paVar11) {
              sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                (&threads,1,"vector::_M_realloc_insert");
              ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_start;
              ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                                 (&threads.
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                                  sVar5);
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__8>
                        ((allocator_type *)(((long)paVar11 - (long)ptVar1) + (long)ptVar6),
                         (thread *)&gtest_ar_,__args_14);
              ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                 (ptVar1,(thread *)paVar8,ptVar6,(allocator<std::thread> *)&threads)
              ;
              paVar11 = (allocator_type *)
                        std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                  ((thread *)paVar8,ptVar12,ptVar7 + 1,
                                   (allocator<std::thread> *)&threads);
              std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                        ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar1,
                         (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar1 >>
                         3);
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = ptVar6 + sVar5;
              __args_15 = extraout_RDX_11;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start = ptVar6;
            }
            else {
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__8>
                        (paVar8,(thread *)&gtest_ar_,__args_13);
              paVar11 = (allocator_type *)
                        (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1);
              __args_15 = extraout_RDX_10;
            }
            ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            gtest_ar_._0_8_ = &connect_with_session;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )&expired_session1;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)paVar11;
            if (paVar11 ==
                (allocator_type *)
                threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                (&threads,1,"vector::_M_realloc_insert");
              ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                                  (&threads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                                   sVar5);
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__9>
                        ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                         (thread *)&gtest_ar_,__args_16);
              ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                 (ptVar12,(thread *)paVar11,ptVar10,
                                  (allocator<std::thread> *)&threads);
              paVar11 = (allocator_type *)
                        std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                  ((thread *)paVar11,ptVar6,ptVar7 + 1,
                                   (allocator<std::thread> *)&threads);
              std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                        ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12
                         ,(long)threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >>
                          3);
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = ptVar10 + sVar5;
              __args_17 = extraout_RDX_13;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start = ptVar10;
            }
            else {
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__9>
                        (paVar11,(thread *)&gtest_ar_,__args_15);
              paVar11 = (allocator_type *)
                        (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1);
              __args_17 = extraout_RDX_12;
            }
            ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            gtest_ar_._0_8_ = &connect_with_session;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )&session1;
            threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)paVar11;
            if (paVar11 ==
                (allocator_type *)
                threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                                (&threads,1,"vector::_M_realloc_insert");
              ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              ptVar12 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              ptVar10 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                                  (&threads.
                                    super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                                   sVar5);
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__10>
                        ((allocator_type *)(((long)ptVar1 - (long)ptVar12) + (long)ptVar10),
                         (thread *)&gtest_ar_,__args_18);
              ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                 (ptVar12,(thread *)paVar11,ptVar10,
                                  (allocator<std::thread> *)&threads);
              ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                                 ((thread *)paVar11,ptVar6,ptVar7 + 1,
                                  (allocator<std::thread> *)&threads);
              std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                        ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)&threads,ptVar12
                         ,(long)threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar12 >>
                          3);
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = ptVar10 + sVar5;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start = ptVar10;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish = ptVar7;
            }
            else {
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionCacheThreads_Test::TestBody()::__10>
                        (paVar11,(thread *)&gtest_ar_,__args_17);
              ptVar7 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish + 1;
              ptVar10 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_finish = ptVar7;
            }
            for (; ptVar10 != ptVar7; ptVar10 = ptVar10 + 1) {
              std::thread::join();
            }
            std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&expired_session2);
        }
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&expired_session1);
        goto LAB_0019a66a;
      }
    }
    testing::Message::Message((Message *)&threads);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x19d0,
               "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&threads);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start)->_M_id)._M_thread + 8))();
    }
  }
LAB_0019a66a:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session2);
LAB_0019a674:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&session1);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionCacheThreads) {
  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  if (is_tls13()) {
    // Our TLS 1.3 implementation does not support stateful resumption.
    ASSERT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
    return;
  }

  // Establish two client sessions to test with.
  bssl::UniquePtr<SSL_SESSION> session1 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session1);
  bssl::UniquePtr<SSL_SESSION> session2 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session2);

  auto connect_with_session = [&](SSL_SESSION *session) {
    ClientConfig config;
    config.session = session;
    UniquePtr<SSL> client, server;
    ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                       server_ctx_.get(), config));
  };

  // Resume sessions in parallel with establishing new ones.
  {
    std::vector<std::thread> threads;
    threads.emplace_back([&] { connect_with_session(nullptr); });
    threads.emplace_back([&] { connect_with_session(nullptr); });
    threads.emplace_back([&] { connect_with_session(session1.get()); });
    threads.emplace_back([&] { connect_with_session(session1.get()); });
    threads.emplace_back([&] { connect_with_session(session2.get()); });
    threads.emplace_back([&] { connect_with_session(session2.get()); });
    for (auto &thread : threads) {
      thread.join();
    }
  }

  // Hit the maximum session cache size across multiple threads, to test the
  // size enforcement logic.
  size_t limit = SSL_CTX_sess_number(server_ctx_.get()) + 2;
  SSL_CTX_sess_set_cache_size(server_ctx_.get(), limit);
  {
    std::vector<std::thread> threads;
    for (int i = 0; i < 4; i++) {
      threads.emplace_back([&]() {
        connect_with_session(nullptr);
        EXPECT_LE(SSL_CTX_sess_number(server_ctx_.get()), limit);
      });
    }
    for (auto &thread : threads) {
      thread.join();
    }
    EXPECT_EQ(SSL_CTX_sess_number(server_ctx_.get()), limit);
  }

  // Reset the session cache, this time with a mock clock.
  ASSERT_NO_FATAL_FAILURE(ResetContexts());
  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_current_time_cb(server_ctx_.get(), CurrentTimeCallback);

  // Make some sessions at an arbitrary start time. Then expire them.
  g_current_time.tv_sec = 1000;
  bssl::UniquePtr<SSL_SESSION> expired_session1 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(expired_session1);
  bssl::UniquePtr<SSL_SESSION> expired_session2 =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(expired_session2);
  g_current_time.tv_sec += 100 * SSL_DEFAULT_SESSION_TIMEOUT;

  session1 = CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session1);

  // Every 256 connections, we flush stale sessions from the session cache. Test
  // this logic is correctly synchronized with other connection attempts.
  static const int kNumConnections = 256;
  {
    std::vector<std::thread> threads;
    threads.emplace_back([&] {
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(nullptr);
      }
    });
    threads.emplace_back([&] {
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(nullptr);
      }
    });
    threads.emplace_back([&] {
      // Never connect with |expired_session2|. The session cache eagerly
      // removes expired sessions when it sees them. Leaving |expired_session2|
      // untouched ensures it is instead cleared by periodic flushing.
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(expired_session1.get());
      }
    });
    threads.emplace_back([&] {
      for (int i = 0; i < kNumConnections; i++) {
        connect_with_session(session1.get());
      }
    });
    for (auto &thread : threads) {
      thread.join();
    }
  }
}